

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O0

bufptr __thiscall cornerstone::srv_config::serialize(srv_config *this)

{
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  buffer *in_RSI;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> in_RDI;
  bufptr bVar1;
  string *in_stack_00000008;
  buffer *in_stack_00000010;
  bufptr *buf;
  size_t in_stack_ffffffffffffffd8;
  buffer *in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffec;
  uint val;
  
  val = (uint)in_stack_ffffffffffffffec;
  std::__cxx11::string::length();
  buffer::alloc((size_t)in_stack_00000008);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5e2e);
  buffer::put(in_RSI,val);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5e49);
  buffer::put(in_stack_00000010,in_stack_00000008);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5e66);
  buffer::pos(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar1._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)in_RDI._M_head_impl;
  return (bufptr)bVar1._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr srv_config::serialize() const
{
    bufptr buf = buffer::alloc(sz_int + endpoint_.length() + 1);
    buf->put(id_);
    buf->put(endpoint_);
    buf->pos(0);
    return buf;
}